

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool rw::findChunk(Stream *s,uint32 type,uint32 *length,uint32 *version)

{
  bool bVar1;
  ChunkHeaderInfo header;
  ChunkHeaderInfo local_38;
  
  bVar1 = readChunkHeaderInfo(s,&local_38);
  if (bVar1) {
    do {
      if (local_38.type == 0) {
        return false;
      }
      if (local_38.type == type) {
        if (length != (uint32 *)0x0) {
          *length = local_38.length;
        }
        if (version != (uint32 *)0x0) {
          *version = local_38.version;
          return true;
        }
        return true;
      }
      (*s->_vptr_Stream[5])(s,(ulong)local_38.length,1);
      bVar1 = readChunkHeaderInfo(s,&local_38);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool
findChunk(Stream *s, uint32 type, uint32 *length, uint32 *version)
{
	ChunkHeaderInfo header;
	while(readChunkHeaderInfo(s, &header)){
		if(header.type == ID_NAOBJECT)
			return false;
		if(header.type == type){
			if(length)
				*length = header.length;
			if(version)
				*version = header.version;
			return true;
		}
		s->seek(header.length);
	}
	return false;
}